

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

double __thiscall despot::BaseTag::StepReward(BaseTag *this,Belief *belief,ACT_TYPE action)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  plVar3 = (long *)(**(code **)(*(long *)belief + 0x30))();
  dVar5 = 0.0;
  for (lVar4 = 0; plVar3[1] - *plVar3 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    lVar2 = *(long *)(*plVar3 + lVar4 * 8);
    dVar6 = -1.0;
    if ((action == 4) &&
       (iVar1 = *(int *)(lVar2 + 0xc), dVar6 = TAG_REWARD,
       (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar1] !=
       (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar1])) {
      dVar6 = -TAG_REWARD;
    }
    dVar5 = dVar5 + dVar6 * *(double *)(lVar2 + 0x18);
  }
  return dVar5;
}

Assistant:

double BaseTag::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		TagState* state = static_cast<TagState*>(particle);
		double reward = 0;
		if (action == TagAction()) {
			if (rob_[state->state_id] == opp_[state->state_id]) {
				reward = TAG_REWARD;
			} else {
				reward = -TAG_REWARD;
			}
		} else {
			reward = -1;
		}
		sum += state->weight * reward;
	}

	return sum;
}